

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,TransactionContext *context)

{
  bool bVar1;
  value_type *in_RDX;
  uint32_t in_ESI;
  Psbt *in_RDI;
  TxInReference *txin;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  value_type *in_stack_fffffffffffffa08;
  Transaction *in_stack_fffffffffffffa10;
  UtxoData *this_00;
  undefined4 in_stack_fffffffffffffa20;
  OutPoint *in_stack_fffffffffffffa30;
  TransactionContext *in_stack_fffffffffffffa38;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffffb78;
  Psbt *in_stack_fffffffffffffb80;
  __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
  local_a8;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_a0;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_88;
  Transaction local_58;
  value_type *local_18;
  
  local_18 = in_RDX;
  core::Transaction::Transaction(&local_58,(Transaction *)in_RDX);
  core::Psbt::Psbt(in_RDI,in_ESI,&local_58);
  core::Transaction::~Transaction(in_stack_fffffffffffffa10);
  in_RDI->_vptr_Psbt = (_func_int **)&PTR__Psbt_009efca8;
  this_00 = (UtxoData *)(in_RDI + 1);
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x51bfbf);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x51bfcc);
  core::Transaction::GetTxInList(&local_a0,(Transaction *)local_18);
  local_88 = &local_a0;
  local_a8._M_current =
       (TxInReference *)
       std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::begin
                 (local_88);
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::end(local_88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                        *)this_00,
                       (__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                        *)in_stack_fffffffffffffa08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
    ::operator*(&local_a8);
    in_stack_fffffffffffffa08 = local_18;
    core::AbstractTxInReference::GetOutPoint((AbstractTxInReference *)local_18);
    TransactionContext::GetTxInUtxoData(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_00,
               in_stack_fffffffffffffa08);
    UtxoData::~UtxoData(this_00);
    core::OutPoint::~OutPoint((OutPoint *)0x51c0f9);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
    ::operator++(&local_a8);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffa20));
  CollectInputUtxo(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffa20));
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const TransactionContext& context)
    : cfd::core::Psbt(psbt_version, static_cast<const Transaction>(context)) {
  std::vector<UtxoData> utxo_list;
  for (const auto& txin : context.GetTxInList()) {
    utxo_list.push_back(context.GetTxInUtxoData(txin.GetOutPoint()));
  }
  CollectInputUtxo(utxo_list);
}